

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

Maybe<const_kj::Exception_&> __thiscall
kj::InFlightExceptionIterator::next(InFlightExceptionIterator *this)

{
  long *in_RSI;
  Exception *local_58;
  ExceptionImpl *local_50;
  ExceptionImpl *result;
  InFlightExceptionIterator *this_local;
  
  if (*in_RSI == 0) {
    Maybe<const_kj::Exception_&>::Maybe((Maybe<const_kj::Exception_&> *)this);
  }
  else {
    if (*in_RSI == 0) {
      local_50 = (ExceptionImpl *)0x0;
    }
    else {
      local_50 = (ExceptionImpl *)(*in_RSI + -8);
    }
    anon_unknown_70::validateExceptionPointer(local_50);
    local_58 = (Exception *)0x0;
    if (local_50->nextCurrentException != (ExceptionImpl *)0x0) {
      local_58 = &local_50->nextCurrentException->super_Exception;
    }
    *in_RSI = (long)local_58;
    Maybe<const_kj::Exception_&>::Maybe
              ((Maybe<const_kj::Exception_&> *)this,&local_50->super_Exception);
  }
  return (Maybe<const_kj::Exception_&>)(Exception *)this;
}

Assistant:

Maybe<const Exception&> InFlightExceptionIterator::next() {
  if (ptr == nullptr) return kj::none;

  const ExceptionImpl* result = static_cast<const ExceptionImpl*>(ptr);
  validateExceptionPointer(result);
  ptr = result->nextCurrentException;
  return *result;
}